

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  uivector nextcode;
  uivector blcount;
  uivector local_78;
  uivector local_58;
  
  local_58.data = (uint *)0x0;
  local_58.size = 0;
  local_58.allocsize = 0;
  local_78.data = (uint *)0x0;
  local_78.size = 0;
  local_78.allocsize = 0;
  puVar6 = (uint *)malloc((ulong)tree->numcodes << 2);
  sVar4 = local_58.size;
  uVar9 = 0x53;
  if (puVar6 != (uint *)0x0) {
    uVar9 = 0;
  }
  tree->tree1d = puVar6;
  uVar8 = (ulong)(tree->maxbitlen + 1);
  uVar5 = uivector_resize(&local_58,uVar8);
  if (((sVar4 <= uVar8 && uVar8 - sVar4 != 0) & (byte)uVar5) == 1) {
    memset(local_58.data + sVar4,0,(uVar8 - sVar4) * 4);
  }
  sVar4 = local_78.size;
  if (uVar5 != 0) {
    uVar8 = (ulong)(tree->maxbitlen + 1);
    uVar5 = uivector_resize(&local_78,uVar8);
    if (((sVar4 <= uVar8 && uVar8 - sVar4 != 0) & (byte)uVar5) == 1) {
      memset(local_78.data + sVar4,0,(uVar8 - sVar4) * 4);
    }
    if (uVar5 != 0) goto LAB_001ae07c;
  }
  uVar9 = 0x53;
LAB_001ae07c:
  if (uVar9 == 0) {
    if (tree->numcodes != 0) {
      puVar6 = tree->lengths;
      uVar8 = 0;
      do {
        local_58.data[puVar6[uVar8]] = local_58.data[puVar6[uVar8]] + 1;
        uVar9 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar9;
      } while (uVar9 != tree->numcodes);
    }
    if (tree->maxbitlen != 0) {
      uVar8 = 1;
      do {
        uVar9 = (int)uVar8 - 1;
        local_78.data[uVar8] = (local_58.data[uVar9] + local_78.data[uVar9]) * 2;
        uVar9 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar9;
      } while (uVar9 <= tree->maxbitlen);
    }
    if (tree->numcodes != 0) {
      puVar6 = tree->lengths;
      uVar9 = 0;
      do {
        uVar8 = (ulong)puVar6[uVar9];
        if (uVar8 != 0) {
          uVar5 = local_78.data[uVar8];
          local_78.data[uVar8] = uVar5 + 1;
          tree->tree1d[uVar9] = uVar5;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != tree->numcodes);
    }
    local_58.size = 0;
    local_58.allocsize = 0;
    free(local_58.data);
    local_58.data = (uint *)0x0;
    local_78.size = 0;
    local_78.allocsize = 0;
    free(local_78.data);
    local_78.data = (uint *)0x0;
    uVar9 = tree->numcodes;
    uVar8 = (ulong)(uVar9 * 2);
    puVar6 = (uint *)malloc(uVar8 * 4);
    tree->tree2d = puVar6;
    if (puVar6 == (uint *)0x0) {
      uVar9 = 0x53;
    }
    else {
      if (uVar8 != 0) {
        uVar7 = 0;
        do {
          puVar6[uVar7] = 0x7fff;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      if ((ulong)uVar9 != 0) {
        puVar1 = tree->lengths;
        uVar7 = 0;
        iVar10 = 0;
        iVar3 = 0;
        do {
          uVar5 = puVar1[uVar7];
          if (uVar5 != 0) {
            puVar2 = tree->tree1d;
            iVar11 = -1;
            uVar12 = 1;
            do {
              bVar15 = iVar10 < 0;
              bVar14 = uVar9 < iVar10 + 2U;
              if (!bVar14 && !bVar15) {
                uVar13 = (uint)((puVar2[uVar7] >> (uVar5 + iVar11 & 0x1f) & 1) != 0) + iVar10 * 2;
                if (puVar6[uVar13] == 0x7fff) {
                  if (uVar12 == uVar5) {
                    puVar6[uVar13] = (uint)uVar7;
                    iVar10 = 0;
                  }
                  else {
                    iVar10 = iVar3 + 1;
                    puVar6[uVar13] = iVar3 + uVar9 + 1;
                    iVar3 = iVar10;
                  }
                }
                else {
                  iVar10 = puVar6[uVar13] - uVar9;
                }
              }
              if (bVar14 || bVar15) {
                return 0x37;
              }
              uVar5 = puVar1[uVar7];
              iVar11 = iVar11 + -1;
              bVar14 = uVar12 != uVar5;
              uVar12 = uVar12 + 1;
            } while (bVar14);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar9);
      }
      if (uVar9 * 2 == 0) {
        uVar9 = 0;
      }
      else {
        uVar7 = 0;
        uVar9 = 0;
        do {
          if (puVar6[uVar7] == 0x7fff) {
            puVar6[uVar7] = 0;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
  }
  else {
    local_58.size = 0;
    local_58.allocsize = 0;
    free(local_58.data);
    local_58.data = (uint *)0x0;
    local_78.size = 0;
    local_78.allocsize = 0;
    free(local_78.data);
  }
  return uVar9;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned error = 0;
  unsigned bits, n;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}